

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::CopyResourceLayout
               (PipelineResourceLayoutDesc *SrcLayout,PipelineResourceLayoutDesc *DstLayout,
               FixedLinearAllocator *MemPool)

{
  float fVar1;
  float fVar2;
  ShaderResourceVariableDesc *pSVar3;
  undefined8 uVar4;
  ImmutableSamplerDesc *pIVar5;
  ShaderResourceVariableDesc *pSVar6;
  Char *pCVar7;
  ImmutableSamplerDesc *Args_10;
  long lVar8;
  Uint32 i;
  ulong uVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  long lVar12;
  byte bVar13;
  ImmutableSamplerDesc *pIVar14;
  string _msg;
  
  bVar13 = 0;
  if (SrcLayout->Variables != (ShaderResourceVariableDesc *)0x0) {
    pSVar6 = FixedLinearAllocator::ConstructArray<Diligent::ShaderResourceVariableDesc>
                       (MemPool,(ulong)SrcLayout->NumVariables);
    DstLayout->Variables = pSVar6;
    lVar12 = 0;
    for (uVar9 = 0; uVar9 < SrcLayout->NumVariables; uVar9 = uVar9 + 1) {
      pSVar3 = SrcLayout->Variables;
      uVar4 = *(undefined8 *)((long)&pSVar3->Name + lVar12);
      *(undefined8 *)((long)&pSVar6->Name + lVar12 + 6) =
           *(undefined8 *)((long)&pSVar3->Name + lVar12 + 6);
      *(undefined8 *)((long)&pSVar6->Name + lVar12) = uVar4;
      pCVar7 = FixedLinearAllocator::CopyString(MemPool,*(char **)((long)&pSVar3->Name + lVar12),0);
      *(Char **)((long)&pSVar6->Name + lVar12) = pCVar7;
      lVar12 = lVar12 + 0x10;
    }
  }
  if (SrcLayout->ImmutableSamplers != (ImmutableSamplerDesc *)0x0) {
    Args_10 = FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
                        (MemPool,(ulong)SrcLayout->NumImmutableSamplers);
    DstLayout->ImmutableSamplers = Args_10;
    lVar12 = 0x38;
    for (uVar9 = 0; uVar9 < SrcLayout->NumImmutableSamplers; uVar9 = uVar9 + 1) {
      pIVar5 = SrcLayout->ImmutableSamplers;
      fVar1 = *(float *)((long)(pIVar5->Desc).BorderColor + lVar12 + -0x38);
      pIVar14 = Args_10;
      if ((((((fVar1 != 0.0) || (NAN(fVar1))) ||
            (fVar2 = *(float *)((long)(pIVar5->Desc).BorderColor + lVar12 + -0x34), fVar2 != 0.0))
           || (NAN(fVar2))) ||
          ((((fVar2 = *(float *)((long)(pIVar5->Desc).BorderColor + lVar12 + -0x30), fVar2 != 0.0 ||
             (NAN(fVar2))) ||
            ((fVar2 = *(float *)((long)(pIVar5->Desc).BorderColor + lVar12 + -0x2c), fVar2 != 0.0 ||
             (NAN(fVar2))))) &&
           (((fVar2 = *(float *)((long)(pIVar5->Desc).BorderColor + lVar12 + -0x30), fVar2 != 0.0 ||
             (NAN(fVar2))) ||
            ((fVar2 = *(float *)((long)(pIVar5->Desc).BorderColor + lVar12 + -0x2c), fVar2 != 1.0 ||
             (NAN(fVar2))))))))) &&
         ((((fVar1 != 1.0 || (NAN(fVar1))) ||
           (fVar1 = *(float *)((long)(pIVar5->Desc).BorderColor + lVar12 + -0x34), fVar1 != 1.0)) ||
          (((NAN(fVar1) ||
            (fVar1 = *(float *)((long)(pIVar5->Desc).BorderColor + lVar12 + -0x30), fVar1 != 1.0))
           || ((NAN(fVar1) ||
               ((fVar1 = *(float *)((long)(pIVar5->Desc).BorderColor + lVar12 + -0x2c), fVar1 != 1.0
                || (NAN(fVar1))))))))))) {
        FormatString<char[33],char_const*,char[27],float,char[3],float,char[3],float,char[3],float,char[131]>
                  (&_msg,(Diligent *)"Immutable sampler for variable \"",
                   (char (*) [33])((long)(pIVar5->Desc).BorderColor + lVar12 + -0x5c),
                   (char **)"\" specifies border color (",
                   (char (*) [27])((long)(pIVar5->Desc).BorderColor + lVar12 + -0x38),
                   (float *)0x2ed5a5,
                   (char (*) [3])((long)(pIVar5->Desc).BorderColor + lVar12 + -0x34),
                   (float *)0x2ed5a5,
                   (char (*) [3])((long)(pIVar5->Desc).BorderColor + lVar12 + -0x30),
                   (float *)0x2ed5a5,
                   (char (*) [3])((long)(pIVar5->Desc).BorderColor + lVar12 + -0x2c),
                   (float *)
                   "). D3D12 static samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors"
                   ,(char (*) [131])Args_10);
        pIVar14 = Args_10;
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
          pIVar14 = Args_10;
        }
        std::__cxx11::string::~string((string *)&_msg);
      }
      puVar10 = (undefined8 *)((long)(pIVar5->Desc).BorderColor + lVar12 + -100);
      puVar11 = (undefined8 *)((long)(pIVar14->Desc).BorderColor + lVar12 + -100);
      for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar11 = *puVar10;
        puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
        puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
      }
      Args_10 = pIVar14;
      pCVar7 = FixedLinearAllocator::CopyString
                         (MemPool,*(char **)((long)(pIVar5->Desc).BorderColor + lVar12 + -0x5c),0);
      *(Char **)((long)(pIVar14->Desc).BorderColor + lVar12 + -0x5c) = pCVar7;
      lVar12 = lVar12 + 0x48;
    }
  }
  return;
}

Assistant:

static void CopyResourceLayout(const PipelineResourceLayoutDesc& SrcLayout, PipelineResourceLayoutDesc& DstLayout, FixedLinearAllocator& MemPool)
    {
        if (SrcLayout.Variables != nullptr)
        {
            ShaderResourceVariableDesc* const Variables = MemPool.ConstructArray<ShaderResourceVariableDesc>(SrcLayout.NumVariables);
            DstLayout.Variables                         = Variables;
            for (Uint32 i = 0; i < SrcLayout.NumVariables; ++i)
            {
                const ShaderResourceVariableDesc& SrcVar{SrcLayout.Variables[i]};
                Variables[i]      = SrcVar;
                Variables[i].Name = MemPool.CopyString(SrcVar.Name);
            }
        }

        if (SrcLayout.ImmutableSamplers != nullptr)
        {
            ImmutableSamplerDesc* const ImmutableSamplers = MemPool.ConstructArray<ImmutableSamplerDesc>(SrcLayout.NumImmutableSamplers);
            DstLayout.ImmutableSamplers                   = ImmutableSamplers;
            for (Uint32 i = 0; i < SrcLayout.NumImmutableSamplers; ++i)
            {
                const ImmutableSamplerDesc& SrcSmplr = SrcLayout.ImmutableSamplers[i];
#ifdef DILIGENT_DEVELOPMENT
                {
                    const Float32* BorderColor = SrcSmplr.Desc.BorderColor;
                    if (!((BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 0) ||
                          (BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 1) ||
                          (BorderColor[0] == 1 && BorderColor[1] == 1 && BorderColor[2] == 1 && BorderColor[3] == 1)))
                    {
                        LOG_WARNING_MESSAGE("Immutable sampler for variable \"", SrcSmplr.SamplerOrTextureName, "\" specifies border color (",
                                            BorderColor[0], ", ", BorderColor[1], ", ", BorderColor[2], ", ", BorderColor[3],
                                            "). D3D12 static samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors");
                    }
                }
#endif

                ImmutableSamplers[i]                      = SrcSmplr;
                ImmutableSamplers[i].SamplerOrTextureName = MemPool.CopyString(SrcSmplr.SamplerOrTextureName);
            }
        }
    }